

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetLinkerTool
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  cmLocalGenerator *pcVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  cmGlobalGenerator *pcVar7;
  string *psVar8;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool local_28a;
  bool local_239;
  string local_200;
  string local_1e0;
  anon_class_1_0_00000001 local_1b9;
  size_t sStack_1b8;
  anon_class_1_0_00000001 isCMakeLinkerType;
  allocator<char> local_181;
  string local_180;
  string *local_160;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_138;
  cmValue local_128;
  cmValue linkerTool;
  undefined1 local_100 [8];
  string linkerType;
  string local_d8;
  cmValue local_b8;
  string_view local_b0;
  string_view local_a0;
  cmValue local_90;
  string local_78;
  cmValue local_58;
  cmValue format;
  undefined1 local_48 [8];
  string usingLinker;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  
  usingLinker.field_2._8_8_ = config;
  bVar3 = IsDeviceLink(this);
  pcVar5 = "";
  if (bVar3) {
    pcVar5 = "DEVICE_";
  }
  format.Value = (string *)pcVar5;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[8],char_const*,char_const(&)[8]>
            ((string *)local_48,(char (*) [7])0x112a736,lang,(char (*) [8])0x1158a00,
             (char **)&format,(char (*) [8])0x11717f7);
  pcVar1 = this->Makefile;
  cmStrCat<std::__cxx11::string&,char_const(&)[5]>
            (&local_78,(string *)local_48,(char (*) [5])0x1128cee);
  local_58 = cmMakefile::GetDefinition(pcVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  bVar3 = cmValue::operator_cast_to_bool(&local_58);
  local_239 = true;
  if (bVar3) {
    local_90.Value = local_58.Value;
    local_b0 = (string_view)::cm::operator____s("TOOL",4);
    local_a0 = local_b0;
    local_239 = ::operator!=(local_90,local_b0);
  }
  if (local_239 != false) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"CMAKE_LINKER",
               (allocator<char> *)(linkerType.field_2._M_local_buf + 0xf));
    local_b8 = cmMakefile::GetDefinition(pcVar1,&local_d8);
    psVar8 = cmValue::operator_cast_to_string_(&local_b8);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)(linkerType.field_2._M_local_buf + 0xf));
    linkerType.field_2._8_4_ = 1;
    goto LAB_009fa456;
  }
  GetLinkerTypeProperty((string *)local_100,this,lang,(string *)usingLinker.field_2._8_8_);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_100,"DEFAULT");
  }
  cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
            ((string *)&linkerTool,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  std::__cxx11::string::operator=((string *)local_48,(string *)&linkerTool);
  std::__cxx11::string::~string((string *)&linkerTool);
  local_128 = cmMakefile::GetDefinition(this->Makefile,(string *)local_48);
  bVar3 = cmValue::operator_cast_to_bool(&local_128);
  if (bVar3) {
LAB_009fa413:
    psVar8 = cmValue::operator_cast_to_string_(&local_128);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar8);
  }
  else {
    pcVar7 = GetGlobalGenerator(this);
    uVar4 = (*pcVar7->_vptr_cmGlobalGenerator[0x2a])();
    local_28a = false;
    if ((uVar4 & 1) != 0) {
      local_138 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
      local_158 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("DEFAULT",7)
      ;
      local_148 = local_158;
      local_28a = std::operator==(local_138,local_158);
    }
    if (local_28a == false) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"CMAKE_LINKER",&local_181);
      local_160 = (string *)cmMakefile::GetDefinition(pcVar1,&local_180);
      local_128 = (cmValue)local_160;
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator(&local_181);
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
      __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("DEFAULT",7);
      sStack_1b8 = __y._M_len;
      bVar3 = std::operator!=(__x,__y);
      if (bVar3) {
        bVar3 = GetLinkerTool::anon_class_1_0_00000001::operator()(&local_1b9,(string *)local_100);
        if (bVar3) {
          pcVar2 = this->LocalGenerator;
          cmStrCat<char_const(&)[14],std::__cxx11::string&,char_const(&)[49]>
                    (&local_1e0,(char (*) [14])"LINKER_TYPE \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     (char (*) [49])"\' is unknown or not supported by this toolchain.");
          cmLocalGenerator::IssueMessage(pcVar2,FATAL_ERROR,&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
        }
        else {
          pcVar2 = this->LocalGenerator;
          cmStrCat<char_const(&)[14],std::__cxx11::string&,char_const(&)[45],std::__cxx11::string&,char_const(&)[12]>
                    (&local_200,(char (*) [14])"LINKER_TYPE \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     (char (*) [45])"\' is unknown. Did you forget to define the \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     (char (*) [12])"\' variable?");
          cmLocalGenerator::IssueMessage(pcVar2,FATAL_ERROR,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
        }
      }
      goto LAB_009fa413;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  linkerType.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_100);
LAB_009fa456:
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetLinkerTool(const std::string& lang,
                                             const std::string& config) const
{
  auto usingLinker =
    cmStrCat("CMAKE_", lang, "_USING_", this->IsDeviceLink() ? "DEVICE_" : "",
             "LINKER_");
  auto format = this->Makefile->GetDefinition(cmStrCat(usingLinker, "MODE"));
  if (!format || format != "TOOL"_s) {
    return this->Makefile->GetDefinition("CMAKE_LINKER");
  }

  auto linkerType = this->GetLinkerTypeProperty(lang, config);
  if (linkerType.empty()) {
    linkerType = "DEFAULT";
  }
  usingLinker = cmStrCat(usingLinker, linkerType);
  auto linkerTool = this->Makefile->GetDefinition(usingLinker);

  if (!linkerTool) {
    if (this->GetGlobalGenerator()->IsVisualStudio() &&
        linkerType == "DEFAULT"_s) {
      return std::string{};
    }

    // fall-back to generic definition
    linkerTool = this->Makefile->GetDefinition("CMAKE_LINKER");

    if (linkerType != "DEFAULT"_s) {
      auto isCMakeLinkerType = [](const std::string& type) -> bool {
        return std::all_of(type.cbegin(), type.cend(),
                           [](char c) { return std::isupper(c); });
      };
      if (isCMakeLinkerType(linkerType)) {
        this->LocalGenerator->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("LINKER_TYPE '", linkerType,
                   "' is unknown or not supported by this toolchain."));
      } else {
        this->LocalGenerator->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("LINKER_TYPE '", linkerType,
                   "' is unknown. Did you forget to define the '", usingLinker,
                   "' variable?"));
      }
    }
  }

  return linkerTool;
}